

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O2

ostream * operator<<(ostream *os,BigInt *obj)

{
  pointer piVar1;
  int i;
  long lVar2;
  
  if (obj->_isNegative == true) {
    std::operator<<(os,"-");
  }
  for (lVar2 = 0;
      piVar1 = (obj->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(obj->digits).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
      lVar2 = lVar2 + 1) {
    std::ostream::operator<<((ostream *)os,piVar1[lVar2]);
  }
  return os;
}

Assistant:

ostream &operator<<(ostream &os, const BigInt &obj)
{
    if (obj.IsNegative()) {
        os << "-";
    }
    
    for (int i = 0; i < obj.getLength(); ++i) {
        os << obj[i];
    }
    
    return os;
}